

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int mainprog(nccfgstate *state)

{
  int iVar1;
  char cVar2;
  int iVar3;
  char *__s;
  mcu8str cmdname;
  
  iVar3 = state->argc;
  cVar2 = '\0';
  if (1 < (long)iVar3) {
    cVar2 = mcplcfg_decode_modeflag(state->argv[1]);
  }
  iVar1 = 2;
  if (cVar2 == 's') {
    iVar1 = 99;
  }
  if ((((int)(cVar2 == 's' | 2) <= iVar3) && (cVar2 != '\0')) && (iVar3 <= iVar1)) {
    if (cVar2 == 's') {
      iVar3 = mcplcfg_mode_show(state,state->argv + 2,state->argv + iVar3);
      return iVar3;
    }
    if (cVar2 == 'h') {
      mcplcfg_show_help(state);
    }
    else {
      if (cVar2 == 'v') {
        __s = "2.0.0";
      }
      else {
        if (cVar2 != 'i') {
          mcplcfg_show_summary(state);
          return 0;
        }
        __s = "2000000";
      }
      puts(__s);
    }
    return 0;
  }
  mcplcfg_thiscmdname(&cmdname,state);
  fprintf(_stderr,
          "%s: error: Missing or invalid arguments. Run with --help for usage instructions.\n",
          cmdname.c_str);
  mcu8str_dealloc(&cmdname);
  return 1;
}

Assistant:

int mainprog( nccfgstate* state )
{
  int argc = state->argc;
  char mode = ( argc >= 2
                ? mcplcfg_decode_modeflag(state->argv[1])
                : MCPLCFG_MODE_INVALID );

  int min_nargs = mode == MCPLCFG_MODE_SHOW ? 3 : 2;
  int max_nargs = mode == MCPLCFG_MODE_SHOW ? 99 : 2;
  if ( mode == MCPLCFG_MODE_INVALID || argc > max_nargs || argc < min_nargs ) {
    mcu8str cmdname = mcplcfg_thiscmdname(state);
    fprintf(stderr,"%s: error: Missing or invalid arguments."
            " Run with --help for usage instructions.\n",cmdname.c_str);
    mcu8str_dealloc(&cmdname);
    return 1;
  }

  if ( mode == MCPLCFG_MODE_SHOW ) {
    const char ** arg0 = (const char**)&(state->argv[0]);
    const char ** argBegin = arg0 + 2;
    const char ** argEnd = arg0 + argc;
    int ec = mcplcfg_mode_show( state, argBegin, argEnd );
    return ec;
  }

  if ( mode == MCPLCFG_MODE_INTVERSION ) {
    printf("%s\n",mcplcfg_const_intversion());
  } else if ( mode == MCPLCFG_MODE_VERSION ) {
    printf("%s\n",mcplcfg_const_version());
  } else if ( mode == MCPLCFG_MODE_HELP ) {
    mcplcfg_show_help(state);
  } else {
    assert( mode == MCPLCFG_MODE_SUMMARY );
    mcplcfg_show_summary(state);
  }

  return 0;
}